

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::printClosedHeader(ConsoleReporter *this,string *_name)

{
  ostream *poVar1;
  undefined8 in_RAX;
  size_t sVar2;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX;
  printOpenHeader(this,_name);
  poVar1 = (this->super_StreamingReporterBase<Catch::ConsoleReporter>).stream;
  if (getLineOfChars<(char)46>()::line == '\0') {
    uRam00000000001a9260 = 0x2e2e2e2e2e2e2e;
    uRam00000000001a9267._0_1_ = '.';
    uRam00000000001a9267._1_1_ = '.';
    uRam00000000001a9267._2_1_ = '.';
    uRam00000000001a9267._3_1_ = '.';
    uRam00000000001a9267._4_1_ = '.';
    uRam00000000001a9267._5_1_ = '.';
    uRam00000000001a9267._6_1_ = '.';
    uRam00000000001a9267._7_1_ = '.';
    DAT_001a9250 = '.';
    DAT_001a9250_1._0_1_ = '.';
    DAT_001a9250_1._1_1_ = '.';
    DAT_001a9250_1._2_1_ = '.';
    DAT_001a9250_1._3_1_ = '.';
    DAT_001a9250_1._4_1_ = '.';
    DAT_001a9250_1._5_1_ = '.';
    DAT_001a9250_1._6_1_ = '.';
    uRam00000000001a9258 = 0x2e2e2e2e2e2e2e;
    DAT_001a925f = 0x2e;
    DAT_001a9240 = '.';
    DAT_001a9240_1._0_1_ = '.';
    DAT_001a9240_1._1_1_ = '.';
    DAT_001a9240_1._2_1_ = '.';
    DAT_001a9240_1._3_1_ = '.';
    DAT_001a9240_1._4_1_ = '.';
    DAT_001a9240_1._5_1_ = '.';
    DAT_001a9240_1._6_1_ = '.';
    uRam00000000001a9248._0_1_ = '.';
    uRam00000000001a9248._1_1_ = '.';
    uRam00000000001a9248._2_1_ = '.';
    uRam00000000001a9248._3_1_ = '.';
    uRam00000000001a9248._4_1_ = '.';
    uRam00000000001a9248._5_1_ = '.';
    uRam00000000001a9248._6_1_ = '.';
    uRam00000000001a9248._7_1_ = '.';
    DAT_001a9230 = '.';
    DAT_001a9230_1._0_1_ = '.';
    DAT_001a9230_1._1_1_ = '.';
    DAT_001a9230_1._2_1_ = '.';
    DAT_001a9230_1._3_1_ = '.';
    DAT_001a9230_1._4_1_ = '.';
    DAT_001a9230_1._5_1_ = '.';
    DAT_001a9230_1._6_1_ = '.';
    uRam00000000001a9238._0_1_ = '.';
    uRam00000000001a9238._1_1_ = '.';
    uRam00000000001a9238._2_1_ = '.';
    uRam00000000001a9238._3_1_ = '.';
    uRam00000000001a9238._4_1_ = '.';
    uRam00000000001a9238._5_1_ = '.';
    uRam00000000001a9238._6_1_ = '.';
    uRam00000000001a9238._7_1_ = '.';
    getLineOfChars<(char)46>()::line = '.';
    getLineOfChars<(char)46>()::line_1._0_1_ = '.';
    getLineOfChars<(char)46>()::line_1._1_1_ = '.';
    getLineOfChars<(char)46>()::line_1._2_1_ = '.';
    getLineOfChars<(char)46>()::line_1._3_1_ = '.';
    getLineOfChars<(char)46>()::line_1._4_1_ = '.';
    getLineOfChars<(char)46>()::line_1._5_1_ = '.';
    getLineOfChars<(char)46>()::line_1._6_1_ = '.';
    uRam00000000001a9228._0_1_ = '.';
    uRam00000000001a9228._1_1_ = '.';
    uRam00000000001a9228._2_1_ = '.';
    uRam00000000001a9228._3_1_ = '.';
    uRam00000000001a9228._4_1_ = '.';
    uRam00000000001a9228._5_1_ = '.';
    uRam00000000001a9228._6_1_ = '.';
    uRam00000000001a9228._7_1_ = '.';
    DAT_001a926f = 0;
  }
  sVar2 = strlen(&getLineOfChars<(char)46>()::line);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&getLineOfChars<(char)46>()::line,sVar2)
  ;
  uStack_18 = CONCAT17(10,(undefined7)uStack_18);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_18 + 7),1);
  return;
}

Assistant:

void ConsoleReporter::printClosedHeader(std::string const& _name) {
    printOpenHeader(_name);
    stream << getLineOfChars<'.'>() << '\n';
}